

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_ldst.inc.c
# Opt level: O1

uint32_t address_space_ldl_be_riscv32
                   (uc_struct_conflict12 *uc,AddressSpace *as,hwaddr addr,MemTxAttrs attrs,
                   MemTxResult *result)

{
  uint uVar1;
  MemTxResult MVar2;
  MemoryRegion_conflict *mr;
  uint *puVar3;
  hwaddr addr1;
  uint64_t val;
  hwaddr l;
  ram_addr_t local_38;
  uint local_30 [2];
  hwaddr local_28;
  
  local_28 = 4;
  mr = flatview_translate_riscv32(uc,as->current_map,addr,&local_38,&local_28,false,attrs);
  if ((local_28 < 4) || (mr->ram == false)) {
    MVar2 = memory_region_dispatch_read_riscv32(uc,mr,local_38,(uint64_t *)local_30,MO_BEUL,attrs);
  }
  else {
    puVar3 = (uint *)qemu_map_ram_ptr_riscv32(mr->uc,mr->ram_block,local_38);
    uVar1 = *puVar3;
    local_30[0] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    MVar2 = 0;
  }
  if (result != (MemTxResult *)0x0) {
    *result = MVar2;
  }
  return local_30[0];
}

Assistant:

uint32_t glue(address_space_ldl_be, SUFFIX)(struct uc_struct *uc, ARG1_DECL,
    hwaddr addr, MemTxAttrs attrs, MemTxResult *result)
{
    return glue(address_space_ldl_internal, SUFFIX)(uc, ARG1, addr, attrs, result,
                                                    DEVICE_BIG_ENDIAN);
}